

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * tokenExpr(Parse *pParse,int op,Token t)

{
  Expr *pPtr;
  ulong __n;
  Expr *z;
  long in_FS_OFFSET;
  Token local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.n = t.n;
  __n = (ulong)local_48.n;
  local_48.z = t.z;
  pPtr = (Expr *)sqlite3DbMallocRawNN(pParse->db,__n + 0x49);
  if (pPtr != (Expr *)0x0) {
    pPtr->op = (u8)op;
    pPtr->affExpr = '\0';
    pPtr->op2 = '\0';
    pPtr->flags = 0x800000;
    pPtr->pAggInfo = (AggInfo *)0x0;
    (pPtr->y).pTab = (Table *)0x0;
    pPtr->pLeft = (Expr *)0x0;
    pPtr->pRight = (Expr *)0x0;
    (pPtr->x).pList = (ExprList *)0x0;
    pPtr->iTable = 0;
    pPtr->iColumn = 0;
    z = pPtr + 1;
    (pPtr->u).zToken = (char *)z;
    memcpy(z,t.z,__n);
    (&pPtr[1].op)[__n] = '\0';
    (pPtr->w).iJoin = (int)t.z - *(int *)&pParse->zTail;
    if ((char)""[pPtr[1].op] < '\0') {
      pPtr->flags = (uint)(pPtr[1].op == 0x22) << 7 | 0x4800000;
      sqlite3Dequote((char *)z);
    }
    pPtr->nHeight = 1;
    if (1 < pParse->eParseMode) {
      sqlite3RenameTokenMap(pParse,pPtr,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pPtr;
  }
  __stack_chk_fail();
}

Assistant:

static Expr *tokenExpr(Parse *pParse, int op, Token t){
    Expr *p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr)+t.n+1);
    if( p ){
      /* memset(p, 0, sizeof(Expr)); */
      p->op = (u8)op;
      p->affExpr = 0;
      p->flags = EP_Leaf;
      ExprClearVVAProperties(p);
      /* p->iAgg = -1; // Not required */
      p->pLeft = p->pRight = 0;
      p->pAggInfo = 0;
      memset(&p->x, 0, sizeof(p->x));
      memset(&p->y, 0, sizeof(p->y));
      p->op2 = 0;
      p->iTable = 0;
      p->iColumn = 0;
      p->u.zToken = (char*)&p[1];
      memcpy(p->u.zToken, t.z, t.n);
      p->u.zToken[t.n] = 0;
      p->w.iOfst = (int)(t.z - pParse->zTail);
      if( sqlite3Isquote(p->u.zToken[0]) ){
        sqlite3DequoteExpr(p);
      }
#if SQLITE_MAX_EXPR_DEPTH>0
      p->nHeight = 1;
#endif
      if( IN_RENAME_OBJECT ){
        return (Expr*)sqlite3RenameTokenMap(pParse, (void*)p, &t);
      }
    }
    return p;
  }